

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::binResMinimize(Solver *this,vec<Minisat::Lit> *out_learnt)

{
  unsigned_long uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  Lit *pLVar5;
  unsigned_long *puVar6;
  Watcher *pWVar7;
  Lit *pLVar8;
  vec<Minisat::Lit> *in_RSI;
  long in_RDI;
  int i_2;
  int last;
  Lit the_other;
  int i_1;
  int to_remove;
  vec<Minisat::Watcher> *ws;
  int i;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
  *in_stack_ffffffffffffff60;
  bool local_85;
  int local_50;
  int local_4c;
  lbool local_41;
  int local_40;
  lbool local_39;
  int local_38;
  Lit local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  vec<Minisat::Watcher> *local_20;
  int local_18;
  int local_14;
  vec<Minisat::Lit> *local_10;
  
  *(long *)(in_RDI + 0x5d0) = *(long *)(in_RDI + 0x5d0) + 1;
  local_10 = in_RSI;
  for (local_14 = 1; iVar4 = local_14, iVar3 = vec<Minisat::Lit>::size(local_10), iVar4 < iVar3;
      local_14 = local_14 + 1) {
    uVar1 = *(unsigned_long *)(in_RDI + 0x5d0);
    pLVar5 = vec<Minisat::Lit>::operator[](local_10,local_14);
    local_18 = pLVar5->x;
    iVar4 = var((Lit)local_18);
    puVar6 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),iVar4);
    *puVar6 = uVar1;
  }
  pLVar5 = vec<Minisat::Lit>::operator[](local_10,0);
  local_28 = pLVar5->x;
  local_24 = (int)operator~((Lit)local_28);
  local_20 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
             operator[](in_stack_ffffffffffffff60,
                        (Lit *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  *(long *)(in_RDI + 0x208) = *(long *)(in_RDI + 0x208) + 1;
  local_2c = 0;
  for (local_30 = 0; iVar4 = local_30, iVar3 = vec<Minisat::Watcher>::size(local_20), iVar4 < iVar3;
      local_30 = local_30 + 1) {
    pWVar7 = vec<Minisat::Watcher>::operator[](local_20,local_30);
    local_38 = (pWVar7->blocker).x;
    local_34.x = local_38;
    iVar4 = var((Lit)local_38);
    puVar6 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),iVar4);
    local_85 = false;
    if (*puVar6 == *(unsigned_long *)(in_RDI + 0x5d0)) {
      local_40 = local_34.x;
      local_39 = value((Solver *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (Lit)(int)in_stack_ffffffffffffff60);
      lbool::lbool(&local_41,'\0');
      local_85 = lbool::operator==(&local_39,local_41);
    }
    if (local_85 != false) {
      local_2c = local_2c + 1;
      lVar2 = *(long *)(in_RDI + 0x5d0);
      in_stack_ffffffffffffff60 =
           (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
           (in_RDI + 0x5c0);
      iVar4 = var(local_34);
      puVar6 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)in_stack_ffffffffffffff60,iVar4)
      ;
      *puVar6 = lVar2 - 1;
    }
  }
  if (0 < local_2c) {
    local_4c = vec<Minisat::Lit>::size(local_10);
    local_4c = local_4c + -1;
    local_50 = 1;
    while (iVar4 = local_50, iVar3 = vec<Minisat::Lit>::size(local_10), iVar4 < iVar3 - local_2c) {
      pLVar5 = vec<Minisat::Lit>::operator[](local_10,local_50);
      iVar4 = var((Lit)pLVar5->x);
      puVar6 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),iVar4);
      if (*puVar6 != *(unsigned_long *)(in_RDI + 0x5d0)) {
        pLVar5 = vec<Minisat::Lit>::operator[](local_10,local_4c);
        pLVar8 = vec<Minisat::Lit>::operator[](local_10,local_50);
        pLVar8->x = pLVar5->x;
        local_50 = local_50 + -1;
        local_4c = local_4c + -1;
      }
      local_50 = local_50 + 1;
    }
    vec<Minisat::Lit>::shrink(local_10,local_2c);
  }
  return local_2c != 0;
}

Assistant:

bool Solver::binResMinimize(vec<Lit> &out_learnt)
{
    // Preparation: remember which false variables we have in 'out_learnt'.
    counter++;
    for (int i = 1; i < out_learnt.size(); i++) seen2[var(out_learnt[i])] = counter;

    // Get the list of binary clauses containing 'out_learnt[0]'.
    const vec<Watcher> &ws = watches_bin[~out_learnt[0]];
    statistics.solveSteps++;

    int to_remove = 0;
    for (int i = 0; i < ws.size(); i++) {
        Lit the_other = ws[i].blocker;
        // Does 'the_other' appear negatively in 'out_learnt'?
        if (seen2[var(the_other)] == counter && value(the_other) == l_True) {
            to_remove++;
            seen2[var(the_other)] = counter - 1; // Remember to remove this variable.
        }
    }

    // Shrink.
    if (to_remove > 0) {
        int last = out_learnt.size() - 1;
        for (int i = 1; i < out_learnt.size() - to_remove; i++)
            if (seen2[var(out_learnt[i])] != counter) out_learnt[i--] = out_learnt[last--];
        out_learnt.shrink(to_remove);
    }
    return to_remove != 0;
}